

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.h
# Opt level: O0

void __thiscall
spvtools::opt::DescriptorScalarReplacement::DescriptorScalarReplacement
          (DescriptorScalarReplacement *this,bool flatten_composites,bool flatten_arrays)

{
  bool flatten_arrays_local;
  bool flatten_composites_local;
  DescriptorScalarReplacement *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__DescriptorScalarReplacement_010ed088;
  std::
  map<spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::map(&this->replacement_variables_);
  this->flatten_composites_ = flatten_composites;
  this->flatten_arrays_ = flatten_arrays;
  return;
}

Assistant:

DescriptorScalarReplacement(bool flatten_composites, bool flatten_arrays)
      : flatten_composites_(flatten_composites),
        flatten_arrays_(flatten_arrays) {}